

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

void __thiscall
Js::IntlEngineInterfaceExtensionObject::IntlEngineInterfaceExtensionObject
          (IntlEngineInterfaceExtensionObject *this,ScriptContext *scriptContext)

{
  nullptr_t local_50;
  nullptr_t local_48;
  nullptr_t local_40;
  nullptr_t local_38;
  nullptr_t local_30;
  nullptr_t local_28;
  nullptr_t local_20;
  ScriptContext *local_18;
  ScriptContext *scriptContext_local;
  IntlEngineInterfaceExtensionObject *this_local;
  
  local_18 = scriptContext;
  scriptContext_local = (ScriptContext *)this;
  EngineExtensionObjectBase::EngineExtensionObjectBase
            (&this->super_EngineExtensionObjectBase,EngineInterfaceExtensionKind_Intl,scriptContext)
  ;
  (this->super_EngineExtensionObjectBase)._vptr_EngineExtensionObjectBase =
       (_func_int **)&PTR_Initialize_01e00de0;
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->dateToLocaleTimeString,&local_20);
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->dateToLocaleDateString,&local_28);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->numberToLocaleString,&local_30);
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->stringLocaleCompare,&local_38);
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->dateToLocaleString,&local_40);
  local_48 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierPtr(&this->intlNativeInterfaces,&local_48)
  ;
  local_50 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierPtr(&this->intlByteCode,&local_50);
  this->wasInitialized = false;
  return;
}

Assistant:

IntlEngineInterfaceExtensionObject::IntlEngineInterfaceExtensionObject(Js::ScriptContext* scriptContext) :
        EngineExtensionObjectBase(EngineInterfaceExtensionKind_Intl, scriptContext),
        dateToLocaleString(nullptr),
        dateToLocaleTimeString(nullptr),
        dateToLocaleDateString(nullptr),
        numberToLocaleString(nullptr),
        stringLocaleCompare(nullptr),
        intlNativeInterfaces(nullptr),
        intlByteCode(nullptr),
        wasInitialized(false)
    {
    }